

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comm.c
# Opt level: O3

void colorconv(char *buffer,char *txt,CHAR_DATA *ch)

{
  char *pcVar1;
  char cVar2;
  bool bVar3;
  uint uVar4;
  
  if (txt == (char *)0x0) {
    return;
  }
  if (((ch->act[0] & 0x100) == 0) && (bVar3 = is_npc(ch), !bVar3)) {
    do {
      cVar2 = *txt;
      if (cVar2 == '{') {
        txt = txt + 1;
      }
      else {
        if (cVar2 == '\0') goto LAB_0027ac10;
        *buffer = cVar2;
        buffer[1] = '\0';
        buffer = buffer + 1;
      }
      txt = txt + 1;
    } while( true );
  }
  do {
    cVar2 = *txt;
    if (cVar2 == '{') {
      pcVar1 = txt + 1;
      txt = txt + 1;
      uVar4 = color(*pcVar1,ch,buffer);
      if (0 < (int)uVar4) {
        buffer = buffer + uVar4;
      }
    }
    else {
      if (cVar2 == '\0') {
LAB_0027ac10:
        *buffer = '\0';
        return;
      }
      *buffer = cVar2;
      buffer[1] = '\0';
      buffer = buffer + 1;
    }
    txt = txt + 1;
  } while( true );
}

Assistant:

void colorconv(char *buffer, const char *txt, CHAR_DATA *ch)
{
	const char *point;
	int skip = 0;

	if (txt)
	{
		if (IS_SET(ch->act, PLR_COLOR) || is_npc(ch))
		{
			for (point = txt; *point; point++)
			{
				if (*point == '{')
				{
					point++;
					skip = color(*point, ch, buffer);

					while (skip-- > 0)
					{
						++buffer;
					}

					continue;
				}

				*buffer = *point;
				*++buffer = '\0';
			}

			*buffer = '\0';
		}
		else
		{
			for (point = txt; *point; point++)
			{
				if (*point == '{')
				{
					point++;
					continue;
				}

				*buffer = *point;
				*++buffer = '\0';
			}

			*buffer = '\0';
		}
	}
}